

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::FoldRecurrentAddExpressions
          (SENodeSimplifyImpl *this,SENode *root)

{
  _Rb_tree_header *p_Var1;
  ScalarEvolutionAnalysis *pSVar2;
  pointer ppSVar3;
  iterator __position;
  void *pvVar4;
  uint32_t uVar5;
  pointer ppVar6;
  SENodeSimplifyImpl *pSVar7;
  _Rb_tree_node_base *p_Var8;
  SENodeSimplifyImpl *pSVar9;
  int iVar10;
  undefined4 extraout_var;
  SERecurrentNode *pSVar11;
  _Link_type p_Var12;
  vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
  *pvVar13;
  vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
  *extraout_RAX;
  SENode *pSVar14;
  SENode *node_00;
  SENode *pSVar15;
  key_type pLVar16;
  key_type pLVar17;
  long lVar18;
  undefined4 extraout_var_01;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  _Var19;
  undefined4 extraout_var_02;
  _Rb_tree_node_base *p_Var20;
  _Link_type p_Var21;
  SERecurrentNode *node;
  pointer ppSVar22;
  pointer ppVar23;
  bool bVar24;
  bool bVar25;
  Loop *loop;
  pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
  pair;
  key_type local_c8;
  SENode *local_c0;
  key_type local_b8;
  SERecurrentNode *local_b0;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_a8;
  undefined1 local_a0 [16];
  pointer local_90;
  long local_88;
  SENodeSimplifyImpl *local_80;
  _Rb_tree_node_base *local_78;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_70;
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  local_68;
  undefined4 extraout_var_00;
  
  local_c0 = (SENode *)operator_new(0x30);
  pSVar2 = this->analysis_;
  local_c0->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
  (local_c0->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_c0->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c0->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0->parent_analysis_ = pSVar2;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  local_c0->unique_id_ = SENode::NumberOfNodes;
  local_c0->_vptr_SENode = (_func_int **)&PTR_GetType_00951db8;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar22 = (root->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (root->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pSVar14 = local_c0;
  local_b8 = (key_type)root;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppSVar22 != ppSVar3) {
    local_b0 = (SERecurrentNode *)((ulong)local_b0 & 0xffffffff00000000);
    do {
      pSVar14 = *ppSVar22;
      iVar10 = (**pSVar14->_vptr_SENode)(pSVar14);
      bVar25 = iVar10 == 4;
      if (bVar25) {
        pSVar14 = *(pSVar14->children_).
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar10 = (**pSVar14->_vptr_SENode)(pSVar14);
      if (iVar10 == 1) {
        iVar10 = (*pSVar14->_vptr_SENode[6])(pSVar14);
        local_c8 = *(key_type *)(CONCAT44(extraout_var,iVar10) + 0x40);
        iVar10 = (*pSVar14->_vptr_SENode[6])(pSVar14);
        pSVar11 = (SERecurrentNode *)CONCAT44(extraout_var_00,iVar10);
        p_Var1 = &local_68._M_impl.super__Rb_tree_header;
        p_Var12 = (_Link_type)p_Var1;
        for (p_Var21 = (_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var21 != (_Link_type)0x0;
            p_Var21 = (_Link_type)
                      (&(((_Rb_tree_node<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>
                           *)(&p_Var21->_M_storage + -1))->super__Rb_tree_node_base)._M_left)
                      [bVar24]) {
          bVar24 = *(key_type *)(p_Var21->_M_storage)._M_storage < local_c8;
          if (!bVar24) {
            p_Var12 = p_Var21;
          }
        }
        p_Var21 = (_Link_type)p_Var1;
        if ((p_Var12 != (_Link_type)p_Var1) &&
           (p_Var21 = p_Var12, local_c8 < *(key_type *)(p_Var12->_M_storage)._M_storage)) {
          p_Var21 = (_Link_type)p_Var1;
        }
        if (p_Var21 == (_Link_type)p_Var1) {
          local_a0._0_8_ = pSVar11;
          local_a0[8] = bVar25;
          pvVar13 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                     *)std::
                       map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                       ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                     *)&local_68,&local_c8);
          std::
          vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
          ::_M_assign_aux<std::pair<spvtools::opt::SERecurrentNode*,bool>const*>
                    (pvVar13,local_a0,&local_90);
        }
        else {
          pvVar13 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                     *)std::
                       map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                       ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                     *)&local_68,&local_c8);
          __position._M_current = *(pair<spvtools::opt::SERecurrentNode_*,_bool> **)(pvVar13 + 8);
          if (__position._M_current ==
              *(pair<spvtools::opt::SERecurrentNode_*,_bool> **)(pvVar13 + 0x10)) {
            local_a0._0_8_ = pSVar11;
            local_a0[8] = bVar25;
            std::
            vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
            ::_M_realloc_insert<std::pair<spvtools::opt::SERecurrentNode*,bool>>
                      (pvVar13,__position,(pair<spvtools::opt::SERecurrentNode_*,_bool> *)local_a0);
            pvVar13 = extraout_RAX;
          }
          else {
            (__position._M_current)->first = pSVar11;
            *(ulong *)&(__position._M_current)->second = CONCAT71(local_a0._9_7_,bVar25);
            *(long *)(pvVar13 + 8) = *(long *)(pvVar13 + 8) + 0x10;
            local_a0._0_8_ = pSVar11;
            local_a0[8] = bVar25;
          }
          local_b0 = (SERecurrentNode *)
                     CONCAT44(local_b0._4_4_,(int)CONCAT71((int7)((ulong)pvVar13 >> 8),1));
        }
      }
      else {
        (*local_c0->_vptr_SENode[3])(local_c0,pSVar14);
      }
      ppSVar22 = ppSVar22 + 1;
    } while (ppSVar22 != ppSVar3);
    pSVar14 = local_c0;
    root = (SENode *)local_b8;
    if (((ulong)local_b0 & 1) != 0) {
      bVar25 = (_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left ==
               &local_68._M_impl.super__Rb_tree_header;
      pSVar9 = this;
      pSVar7 = local_80;
      p_Var8 = local_78;
      local_78 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      while (local_80 = pSVar9, !bVar25) {
        local_a0._0_8_ = *(undefined8 *)(local_78 + 1);
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
        ::vector((vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                  *)(local_a0 + 8),
                 (vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                  *)&local_78[1]._M_parent);
        local_b0 = (SERecurrentNode *)local_a0._0_8_;
        pSVar14 = (SENode *)operator_new(0x30);
        pSVar2 = this->analysis_;
        pSVar14->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
        (pSVar14->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pSVar14->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar14->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pSVar14->parent_analysis_ = pSVar2;
        uVar5 = SENode::NumberOfNodes;
        SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
        pSVar14->unique_id_ = SENode::NumberOfNodes;
        pSVar14->_vptr_SENode = (_func_int **)&PTR_GetType_00951db8;
        node_00 = (SENode *)operator_new(0x30);
        ppVar6 = local_90;
        node_00->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
        (node_00->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (node_00->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (node_00->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        node_00->parent_analysis_ = pSVar2;
        SENode::NumberOfNodes = uVar5 + 2;
        node_00->unique_id_ = SENode::NumberOfNodes;
        node_00->_vptr_SENode = (_func_int **)&PTR_GetType_00951db8;
        for (ppVar23 = (pointer)CONCAT71(local_a0._9_7_,local_a0[8]); ppVar23 != ppVar6;
            ppVar23 = ppVar23 + 1) {
          pSVar11 = ppVar23->first;
          if ((ppVar23->second & 1U) == 0) {
            (*pSVar14->_vptr_SENode[3])(pSVar14,pSVar11->coefficient_);
            pSVar15 = pSVar11->offset_;
          }
          else {
            pSVar15 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar11->coefficient_)
            ;
            (*pSVar14->_vptr_SENode[3])(pSVar14,pSVar15);
            pSVar15 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar11->offset_);
          }
          (*node_00->_vptr_SENode[3])(node_00,pSVar15);
        }
        pSVar15 = (SENode *)operator_new(0x48);
        pSVar2 = this->analysis_;
        pSVar15->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00951a38;
        (pSVar15->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar15->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar15->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar15->parent_analysis_ = pSVar2;
        SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
        pSVar15->unique_id_ = SENode::NumberOfNodes;
        pSVar15->_vptr_SENode = (_func_int **)&PTR_GetType_00951c48;
        pSVar15[1].children_.
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0;
        pLVar16 = (key_type)ScalarEvolutionAnalysis::SimplifyExpression(pSVar2,pSVar14);
        pLVar17 = (key_type)ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,node_00);
        iVar10 = (*(code *)pLVar16->context_->syntax_context_)(pLVar16);
        if ((iVar10 == 0) &&
           (lVar18 = (*(code *)(pLVar16->context_->grammar_).extInstTable_)(pLVar16),
           *(long *)(lVar18 + 0x30) == 0)) {
          bVar24 = false;
          local_b8 = pLVar17;
        }
        else {
          pSVar15[1]._vptr_SENode = (_func_int **)pLVar16;
          local_c8 = pLVar16;
          iVar10 = (*pSVar15->_vptr_SENode[4])(pSVar15);
          if (CONCAT44(extraout_var_01,iVar10) != 0) {
LAB_006108c0:
            __assert_fail("false && \"Trying to add a child node to a constant!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                          ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
          }
          _Var19 = std::
                   __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                             ((pSVar15->children_).
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (pSVar15->children_).
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_c8);
          std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                    (&pSVar15->children_,(const_iterator)_Var19._M_current,(value_type *)&local_c8);
          pSVar15[1].children_.
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar17;
          local_c8 = pLVar17;
          iVar10 = (*pSVar15->_vptr_SENode[4])(pSVar15);
          if (CONCAT44(extraout_var_02,iVar10) != 0) goto LAB_006108c0;
          _Var19 = std::
                   __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                             ((pSVar15->children_).
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (pSVar15->children_).
                              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_c8);
          std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                    (&pSVar15->children_,(const_iterator)_Var19._M_current,(value_type *)&local_c8);
          this = local_80;
          local_a8._M_head_impl = pSVar15;
          pSVar15 = ScalarEvolutionAnalysis::GetCachedOrAdd
                              (local_80->analysis_,
                               (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                *)&local_a8);
          (*local_c0->_vptr_SENode[3])(local_c0,pSVar15);
          if (local_a8._M_head_impl != (SENode *)0x0) {
            (*(local_a8._M_head_impl)->_vptr_SENode[2])();
          }
          local_a8._M_head_impl = (SENode *)0x0;
          bVar24 = true;
          pSVar15 = (SENode *)0x0;
        }
        if (pSVar15 != (SENode *)0x0) {
          (*pSVar15->_vptr_SENode[2])(pSVar15);
        }
        (*node_00->_vptr_SENode[2])(node_00);
        (*pSVar14->_vptr_SENode[2])(pSVar14);
        pvVar4 = (void *)CONCAT71(local_a0._9_7_,local_a0[8]);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,local_88 - (long)pvVar4);
        }
        pSVar7 = local_80;
        p_Var8 = local_78;
        if (!bVar24) break;
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_78);
        pSVar9 = local_80;
        pSVar7 = local_80;
        p_Var8 = local_78;
        local_78 = p_Var20;
        bVar25 = (_Rb_tree_header *)p_Var20 == &local_68._M_impl.super__Rb_tree_header;
      }
      local_78 = p_Var8;
      local_80 = pSVar7;
      pSVar14 = local_c0;
      root = (SENode *)local_b8;
      if (bVar25) {
        ppSVar22 = (local_c0->children_).
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(local_c0->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar22 == 8) {
          root = *ppSVar22;
        }
        else {
          local_70._M_head_impl = local_c0;
          root = ScalarEvolutionAnalysis::GetCachedOrAdd
                           (this->analysis_,
                            (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                             *)&local_70);
          if (local_70._M_head_impl != (SENode *)0x0) {
            (*(local_70._M_head_impl)->_vptr_SENode[2])();
          }
          local_70._M_head_impl = (SENode *)0x0;
          pSVar14 = (SENode *)0x0;
        }
      }
    }
  }
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (pSVar14 != (SENode *)0x0) {
    (*pSVar14->_vptr_SENode[2])(pSVar14);
  }
  return (SENode *)(key_type)root;
}

Assistant:

SENode* SENodeSimplifyImpl::FoldRecurrentAddExpressions(SENode* root) {
  std::unique_ptr<SEAddNode> new_node{new SEAddNode(&analysis_)};

  // A mapping of loops to the list of recurrent expressions which are with
  // respect to those loops.
  std::map<const Loop*, std::vector<std::pair<SERecurrentNode*, bool>>>
      loops_to_recurrent{};

  bool has_multiple_same_loop_recurrent_terms = false;

  for (SENode* child : *root) {
    bool negation = false;

    if (child->GetType() == SENode::Negative) {
      child = child->GetChild(0);
      negation = true;
    }

    if (child->GetType() == SENode::RecurrentAddExpr) {
      const Loop* loop = child->AsSERecurrentNode()->GetLoop();

      SERecurrentNode* rec = child->AsSERecurrentNode();
      if (loops_to_recurrent.find(loop) == loops_to_recurrent.end()) {
        loops_to_recurrent[loop] = {std::make_pair(rec, negation)};
      } else {
        loops_to_recurrent[loop].push_back(std::make_pair(rec, negation));
        has_multiple_same_loop_recurrent_terms = true;
      }
    } else {
      new_node->AddChild(child);
    }
  }

  if (!has_multiple_same_loop_recurrent_terms) return root;

  for (auto pair : loops_to_recurrent) {
    std::vector<std::pair<SERecurrentNode*, bool>>& recurrent_expressions =
        pair.second;
    const Loop* loop = pair.first;

    std::unique_ptr<SENode> new_coefficient{new SEAddNode(&analysis_)};
    std::unique_ptr<SENode> new_offset{new SEAddNode(&analysis_)};

    for (auto node_pair : recurrent_expressions) {
      SERecurrentNode* node = node_pair.first;
      bool negative = node_pair.second;

      if (!negative) {
        new_coefficient->AddChild(node->GetCoefficient());
        new_offset->AddChild(node->GetOffset());
      } else {
        new_coefficient->AddChild(
            analysis_.CreateNegation(node->GetCoefficient()));
        new_offset->AddChild(analysis_.CreateNegation(node->GetOffset()));
      }
    }

    std::unique_ptr<SERecurrentNode> new_recurrent{
        new SERecurrentNode(&analysis_, loop)};

    SENode* new_coefficient_simplified =
        analysis_.SimplifyExpression(new_coefficient.get());

    SENode* new_offset_simplified =
        analysis_.SimplifyExpression(new_offset.get());

    if (new_coefficient_simplified->GetType() == SENode::Constant &&
        new_coefficient_simplified->AsSEConstantNode()->FoldToSingleValue() ==
            0) {
      return new_offset_simplified;
    }

    new_recurrent->AddCoefficient(new_coefficient_simplified);
    new_recurrent->AddOffset(new_offset_simplified);

    new_node->AddChild(analysis_.GetCachedOrAdd(std::move(new_recurrent)));
  }

  // If we only have one child in the add just return that.
  if (new_node->GetChildren().size() == 1) {
    return new_node->GetChild(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_node));
}